

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O3

void __thiscall jrtplib::RTPUDPv6Transmitter::LeaveAllMulticastGroups(RTPUDPv6Transmitter *this)

{
  HashElement *pHVar1;
  RTPMemoryManager *pRVar2;
  HashElement *pHVar3;
  ipv6_mreq mreq;
  in6_addr mcastIP;
  undefined8 local_58;
  undefined8 uStack_50;
  uint local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  
  if (this->init == true) {
    if (this->created == true) {
      pHVar3 = (this->multicastgroups).firsthashelem;
      (this->multicastgroups).curhashelem = pHVar3;
      if (pHVar3 == (HashElement *)0x0) {
        memset((this->multicastgroups).table,0,0x103e8);
      }
      else {
        do {
          local_58 = *(undefined8 *)&(pHVar3->element).__in6_u;
          uStack_50 = *(undefined8 *)((long)&(pHVar3->element).__in6_u + 8);
          local_48 = this->mcastifidx;
          local_38 = local_58;
          uStack_30 = uStack_50;
          setsockopt(this->rtpsock,0x29,0x15,&local_58,0x14);
          local_58 = local_38;
          uStack_50 = uStack_30;
          local_48 = this->mcastifidx;
          setsockopt(this->rtcpsock,0x29,0x15,&local_58,0x14);
          pHVar3 = (this->multicastgroups).curhashelem;
          if (pHVar3 == (HashElement *)0x0) break;
          pHVar3 = pHVar3->listnext;
          (this->multicastgroups).curhashelem = pHVar3;
        } while (pHVar3 != (HashElement *)0x0);
        pHVar3 = (this->multicastgroups).firsthashelem;
        memset((this->multicastgroups).table,0,0x103e8);
        while (pHVar3 != (HashElement *)0x0) {
          pHVar1 = pHVar3->listnext;
          pRVar2 = (this->multicastgroups).super_RTPMemoryObject.mgr;
          if (pRVar2 == (RTPMemoryManager *)0x0) {
            operator_delete(pHVar3,0x38);
            pHVar3 = pHVar1;
          }
          else {
            (**(code **)(*(long *)pRVar2 + 0x18))(pRVar2,pHVar3);
            pHVar3 = pHVar1;
          }
        }
      }
      (this->multicastgroups).firsthashelem = (HashElement *)0x0;
      (this->multicastgroups).lasthashelem = (HashElement *)0x0;
    }
  }
  return;
}

Assistant:

void RTPUDPv6Transmitter::LeaveAllMulticastGroups()
{
	if (!init)
		return;
	
	MAINMUTEX_LOCK
	if (created)
	{
		multicastgroups.GotoFirstElement();
		while (multicastgroups.HasCurrentElement())
		{
			in6_addr mcastIP;
			int status = 0;

			mcastIP = multicastgroups.GetCurrentElement();
			RTPUDPV6TRANS_MCASTMEMBERSHIP(rtpsock,IPV6_LEAVE_GROUP,mcastIP,status);
			RTPUDPV6TRANS_MCASTMEMBERSHIP(rtcpsock,IPV6_LEAVE_GROUP,mcastIP,status);
			multicastgroups.GotoNextElement();
			JRTPLIB_UNUSED(status);
		}
		multicastgroups.Clear();
	}
	MAINMUTEX_UNLOCK
}